

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::Read(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  uint uVar2;
  double *p;
  int iVar3;
  uint uVar4;
  int iVar5;
  int cv_count1;
  int cv_count0;
  int order1;
  int order0;
  int is_rat;
  int reserved2;
  int reserved1;
  int dim;
  int major_version;
  int count;
  int minor_version;
  ON__INT32 local_8c;
  ON__INT32 local_88;
  ON__INT32 local_84;
  ON__INT32 local_80;
  ON__INT32 local_7c [3];
  ON__INT32 local_70;
  int local_6c;
  ON_BoundingBox local_68;
  int local_34;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  local_6c = 0;
  local_34 = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_6c,&local_34);
  if ((bVar1) && (local_6c == 1)) {
    local_70 = 0;
    local_7c[0] = 0;
    local_80 = 0;
    local_84 = 0;
    local_88 = 0;
    local_8c = 0;
    local_7c[2] = 0;
    local_7c[1] = 0;
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_70);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInt(file,local_7c);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_80);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_84);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_88);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_8c);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,local_7c + 2);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,local_7c + 1);
    }
    if (bVar1 != false) {
      ON_BoundingBox::ON_BoundingBox(&local_68);
      bVar1 = ON_BinaryArchive::ReadBoundingBox(file,&local_68);
    }
    Create(this,local_70,local_7c[0] != 0,local_80,local_84,local_88,local_8c);
    local_68.m_min.x._0_4_ = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
    }
    bVar1 = (bool)(-1 < local_68.m_min.x._0_4_ & bVar1);
    if (bVar1 == true) {
      bVar1 = ReserveKnotCapacity(this,0,local_68.m_min.x._0_4_);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadDouble(file,(long)local_68.m_min.x._0_4_,this->m_knot[0]);
    }
    local_68.m_min.x._0_4_ = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
    }
    bVar1 = (bool)(-1 < local_68.m_min.x._0_4_ & bVar1);
    if (bVar1 == true) {
      bVar1 = ReserveKnotCapacity(this,1,local_68.m_min.x._0_4_);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadDouble(file,(long)local_68.m_min.x._0_4_,this->m_knot[1]);
    }
    local_68.m_min.x._0_4_ = 0;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_68);
    }
    bVar1 = (bool)(-1 < local_68.m_min.x._0_4_ & bVar1);
    uVar4 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    if (bVar1 == true) {
      bVar1 = ReserveCVCapacity(this,local_68.m_min.x._0_4_ * uVar4);
    }
    if ((((bVar1 != false) && (0 < (int)uVar4)) && (0 < local_68.m_min.x._0_4_)) &&
       (bVar1 == true && 0 < this->m_cv_count[0])) {
      iVar3 = 0;
      do {
        if ((0 < this->m_cv_count[1]) && (bVar1 != false)) {
          iVar5 = 1;
          do {
            uVar2 = (iVar5 + -1) * this->m_cv_stride[1] + this->m_cv_stride[0] * iVar3;
            p = this->m_cv + uVar2;
            if ((int)uVar2 < 0) {
              p = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              p = (double *)0x0;
            }
            bVar1 = ON_BinaryArchive::ReadDouble(file,(ulong)uVar4,p);
          } while ((iVar5 < this->m_cv_count[1]) && (iVar5 = iVar5 + 1, bVar1));
        }
        iVar3 = iVar3 + 1;
      } while ((iVar3 < this->m_cv_count[0]) && (bVar1 != false));
    }
  }
  if (bVar1 == false) {
    Destroy(this);
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::Read(
       ON_BinaryArchive&  file // open binary file
     )
{
  DestroySurfaceTree();
  // NOTE - check legacy I/O code if changed
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) {
    // common to all 1.x versions
    int dim = 0, is_rat = 0, order0 = 0, order1 = 0, cv_count0 = 0, cv_count1 = 0;
    int reserved1 = 0, reserved2 = 0;
    if (rc) rc = file.ReadInt( &dim );
    if (rc) rc = file.ReadInt( &is_rat );
    if (rc) rc = file.ReadInt( &order0 );
    if (rc) rc = file.ReadInt( &order1 );
    if (rc) rc = file.ReadInt( &cv_count0 );
    if (rc) rc = file.ReadInt( &cv_count1 );

    if (rc) rc = file.ReadInt(&reserved1);
    if (rc) rc = file.ReadInt(&reserved2);

    if (rc) {
      ON_BoundingBox bbox; // read bounding box - may be used in future
      rc = file.ReadBoundingBox(bbox);
    }
    
    Create( dim, is_rat, order0, order1, cv_count0, cv_count1 );

    int count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(0,count);
    if (rc) rc = file.ReadDouble( count, m_knot[0] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    if (rc ) rc = ReserveKnotCapacity(1,count);
    if (rc) rc = file.ReadDouble( count, m_knot[1] );

    count = 0;
    if (rc) rc = file.ReadInt(&count);
    if (rc && count < 0)
      rc = false;
    const int cv_size = CVSize();
    if (rc) rc = ReserveCVCapacity( count*cv_size );
    if (count > 0 && cv_size > 0 && rc ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.ReadDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  if ( !rc )
    Destroy();
  return rc;
}